

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lambda.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  bool bVar4;
  bool test_ok4;
  SingleFunctor sf1;
  bool test_ok3;
  offset_in_X_to_subr ptrmem;
  X y;
  bool test_ok2;
  function<void_(int_&,_int)> g;
  function<void_(int_&)> f;
  X x;
  bool test_ok1;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  byte bVar5;
  function<void_(int_&,_int)> *in_stack_ffffffffffffff00;
  X *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  bool local_d1;
  int *in_stack_ffffffffffffff30;
  int *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  undefined1 uVar6;
  int *in_stack_ffffffffffffff48;
  X *this;
  anon_class_1_0_00000001_for__M_f *in_stack_ffffffffffffff50;
  function<void_(int_&,_int)> *f_00;
  bool local_9a;
  SingleFunctor local_98;
  bool local_91;
  code *local_90;
  undefined8 local_88;
  code *local_80;
  undefined8 local_78;
  X local_6c;
  byte local_65;
  function<void_(int_&,_int)> local_38;
  X local_14;
  bool local_e;
  undefined4 local_c;
  uint local_4;
  
  local_4 = 0;
  poVar2 = std::operator<<((ostream *)&std::cout,"Using ");
  iVar1 = depspawn::get_num_threads();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2," threads\n");
  local_c = 99;
  depspawn::spawn<main::__0,int&,int>
            ((anon_class_1_0_00000001_for__M_f *)
             CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38
             ,in_stack_ffffffffffffff30);
  depspawn::spawn<main::__1,int&,int&>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (int *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  depspawn::wait_for_all();
  local_9a = tmpresult == 100 && i == 200;
  local_e = local_9a;
  poVar2 = std::operator<<((ostream *)&std::cout,"LAMBDA TEST ");
  pcVar3 = "UNSUCCESSFUL";
  if ((local_e & 1U) != 0) {
    pcVar3 = "SUCCESSFUL";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  this = &local_14;
  X::X(this,10);
  f_00 = &local_38;
  std::function<void(int&)>::function<X&,void>
            ((function<void_(int_&)> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
             ,in_stack_ffffffffffffff08);
  std::function<void(int&,int)>::function<X&,void>
            (in_stack_ffffffffffffff00,
             (X *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  depspawn::spawn<std::function<void(int&)>,int&>
            ((function<void_(int_&)> *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40)
             ,in_stack_ffffffffffffff38);
  depspawn::spawn<std::function<void(int&)>,int&>
            ((function<void_(int_&)> *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40)
             ,in_stack_ffffffffffffff38);
  depspawn::spawn<std::function<void(int&,int)>,int&,int&>
            (f_00,&this->v_,(int *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  depspawn::wait_for_all();
  uVar6 = tmpresult == 0x6e && i == 0x14a;
  local_65 = uVar6;
  poVar2 = std::operator<<((ostream *)&std::cout,"STD::FUNCTION TEST ");
  pcVar3 = "UNSUCCESSFUL";
  if ((local_65 & 1) != 0) {
    pcVar3 = "SUCCESSFUL";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  X::X(&local_6c,5);
  local_80 = X::sub;
  local_78 = 0;
  local_90 = X::sub;
  local_88 = 0;
  depspawn::spawn<void(X::*)(int&)const,X&,int&>
            ((offset_in_X_to_subr *)f_00,this,(int *)CONCAT17(uVar6,in_stack_ffffffffffffff40));
  depspawn::spawn<void(X::*)(int&)const,X_const&,int&>
            ((offset_in_X_to_subr *)f_00,this,(int *)CONCAT17(uVar6,in_stack_ffffffffffffff40));
  local_80 = X::operator();
  local_78 = 0;
  depspawn::spawn<void(X::*)(int&)const,X_const&,int&>
            ((offset_in_X_to_subr *)f_00,this,(int *)CONCAT17(uVar6,in_stack_ffffffffffffff40));
  depspawn::wait_for_all();
  local_d1 = tmpresult == 0x69 && i == 0x145;
  local_91 = local_d1;
  poVar2 = std::operator<<((ostream *)&std::cout,"PTR TO MEMBER FUNCTION TEST ");
  pcVar3 = "UNSUCCESSFUL";
  if ((local_91 & 1U) != 0) {
    pcVar3 = "SUCCESSFUL";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  SingleFunctor::SingleFunctor(&local_98,100);
  depspawn::spawn<SingleFunctor&,int&>
            ((SingleFunctor *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             &in_stack_ffffffffffffff08->v_);
  depspawn::spawn<SingleFunctor&,int&>
            ((SingleFunctor *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             &in_stack_ffffffffffffff08->v_);
  depspawn::spawn<SingleFunctor&,int&>
            ((SingleFunctor *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             &in_stack_ffffffffffffff08->v_);
  depspawn::wait_for_all();
  bVar4 = false;
  if ((tmpresult == 0x6a) && (bVar4 = false, i == 0x147)) {
    iVar1 = SingleFunctor::value(&local_98);
    bVar4 = iVar1 == 0x358;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"FUNCTOR TEST ");
  pcVar3 = "UNSUCCESSFUL";
  if (bVar4) {
    pcVar3 = "SUCCESSFUL";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  bVar5 = 0;
  if (((local_e & 1U) != 0) && (bVar5 = 0, (local_65 & 1) != 0)) {
    bVar5 = local_91;
  }
  local_4 = (uint)((bVar5 ^ 0xff) & 1);
  std::function<void_(int_&,_int)>::~function((function<void_(int_&,_int)> *)0x126a8c);
  std::function<void_(int_&)>::~function((function<void_(int_&)> *)0x126a99);
  return local_4;
}

Assistant:

int main()
{
  std::cout << "Using " << get_num_threads() << " threads\n";

  spawn([](int &r, const int& i) { r = i + 1; LOG("setting " << r); }, tmpresult, 99);
  
  spawn([](int &r, const int& i) { r = 2 * i; LOG("setting " << r); }, i, tmpresult);
  
  wait_for_all();

  const bool test_ok1 = (tmpresult == 100) && (i == 200);
  std::cout << "LAMBDA TEST " << (test_ok1 ? "SUCCESSFUL" : "UNSUCCESSFUL") << std::endl;
  
  X x(10);
  
  std::function<void(int&)> f = x;
  std::function<void(int&, int)> g = x;
  
  spawn(f, i);            // i = 200 + 10 = 210
  spawn(f, tmpresult);    // tmpresult = 100 + 10 = 110
  spawn(g, i, tmpresult); // i = 210 + 10 + 110 = 330
  
  wait_for_all();
  
  const bool test_ok2 = (tmpresult == 110) && (i == 330);
  std::cout << "STD::FUNCTION TEST " << (test_ok2 ? "SUCCESSFUL" : "UNSUCCESSFUL") << std::endl;
  
  const X y(5);
  
  void (X::*ptrmem)(int&) const;
  ptrmem = &X::sub;
  
  spawn(&X::sub, x, i);          // i = 330 - 10 = 320
  spawn(ptrmem, y, tmpresult);   // tmpresult = 110 - 5 = 105
  ptrmem = &X::operator();
  spawn(ptrmem, y, i);           // i = 320 + 5 = 325;
  
  wait_for_all();
  
  const bool test_ok3 = (tmpresult == 105) && (i == 325);
  std::cout << "PTR TO MEMBER FUNCTION TEST " << (test_ok3 ? "SUCCESSFUL" : "UNSUCCESSFUL") << std::endl;
  
  SingleFunctor sf1(100);
  spawn(sf1, i);         //sf1.v_ = 100 + 325 = 425;  i++= 326
  spawn(sf1, tmpresult); //sf1.v_ = 425 + 105 = 530;  tmpresult++= 106
  spawn(sf1, i);         //sf1.v_ = 530 + 326 = 856;  i++= 327
  wait_for_all();
  
  const bool test_ok4 = (tmpresult == 106) && (i == 327) && (sf1.value() == 856);
  std::cout << "FUNCTOR TEST " << (test_ok4 ? "SUCCESSFUL" : "UNSUCCESSFUL") << std::endl;
  
  return !(test_ok1 && test_ok2 && test_ok3);
}